

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iraffits.c
# Opt level: O0

int hgets(char *hstring,char *keyword,int lstr,char *str)

{
  char *__s;
  size_t sVar1;
  int lval;
  char *value;
  char *str_local;
  int lstr_local;
  char *keyword_local;
  char *hstring_local;
  
  __s = hgetc(hstring,keyword);
  if (__s == (char *)0x0) {
    hstring_local._4_4_ = 0;
  }
  else {
    sVar1 = strlen(__s);
    if ((int)sVar1 < lstr) {
      strcpy(str,__s);
    }
    else if (lstr < 2) {
      *str = *__s;
    }
    else {
      strncpy(str,__s,(long)(lstr + -1));
      str[lstr + -1] = '\0';
    }
    hstring_local._4_4_ = 1;
  }
  return hstring_local._4_4_;
}

Assistant:

static int
hgets (hstring, keyword, lstr, str)

char *hstring;	/* character string containing FITS header information
		   in the format <keyword>= <value> {/ <comment>} */
char *keyword;	/* character string containing the name of the keyword
		   the value of which is returned.  hget searches for a
		   line beginning with this string.  if "[n]" is present,
		   the n'th token in the value is returned.
		   (the first 8 characters must be unique) */
int lstr;	/* Size of str in characters */
char *str;	/* String (returned) */
{
	char *value;
	int lval;

/* Get value and comment from header string */
	value = hgetc (hstring,keyword);

	if (value != NULL) {
	    lval = strlen (value);
	    if (lval < lstr)
		strcpy (str, value);
	    else if (lstr > 1) {
		strncpy (str, value, lstr-1);
                str[lstr-1]=0;
            }
	    else {
		str[0] = value[0];
            }
	    return (1);
	    }
	else
	    return (0);
}